

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O2

string * __thiscall
DebugInfo::WriteReport_abi_cxx11_
          (string *__return_storage_ptr__,DebugInfo *this,DebugFilters *filters)

{
  pointer pSVar1;
  pointer pTVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  long lVar5;
  bool bVar6;
  pointer pNVar7;
  pointer pOVar8;
  pointer pNVar9;
  uint32_t uVar10;
  ContribInfo *cnt;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  pointer pCVar14;
  uint uVar15;
  SymbolInfo *sym;
  char *__needle;
  pointer pTVar16;
  pointer pSVar17;
  pointer pNVar18;
  pointer pOVar19;
  __normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_> __i;
  pointer pSVar20;
  pointer pTVar21;
  value_type *__x;
  long lVar22;
  pointer pNVar23;
  value_type *pvVar24;
  pointer pOVar25;
  uint32_t uVar26;
  _Alloc_hider _Var27;
  int iVar28;
  uint uVar29;
  string objFile;
  vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> objectFiles;
  vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> nameSpaces;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __needle = (char *)(filters->name)._M_string_length;
  if (__needle != (char *)0x0) {
    __needle = (filters->name)._M_dataplus._M_p;
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if (__needle != (char *)0x0) {
    sAppendPrintF(__return_storage_ptr__,"Only including things with \'%s\' in their name/file\n\n",
                  __needle);
  }
  sAppendPrintF(__return_storage_ptr__,"Functions by size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minFunction * 0.0009765625,0));
  pSVar17 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar17 != pSVar1) {
    uVar11 = ((long)pSVar1 - (long)pSVar17) / 0x30;
    lVar5 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<SymbolInfo*,std::vector<SymbolInfo,std::allocator<SymbolInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__0>>
              (pSVar17,pSVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pSVar1 - (long)pSVar17 < 0x301) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<SymbolInfo*,std::vector<SymbolInfo,std::allocator<SymbolInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__0>>
                (pSVar17,pSVar1);
    }
    else {
      pSVar20 = pSVar17 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<SymbolInfo*,std::vector<SymbolInfo,std::allocator<SymbolInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__0>>
                (pSVar17,pSVar20);
      for (; pSVar20 != pSVar1; pSVar20 = pSVar20 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<SymbolInfo*,std::vector<SymbolInfo,std::allocator<SymbolInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__0>>
                  (pSVar20);
      }
    }
  }
  pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar17 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (pSVar17 != pSVar1 && ((uint)filters->minFunction <= pSVar17->size)); pSVar17 = pSVar17 + 1) {
    if (pSVar17->sectionType == Code) {
      pcVar13 = (pSVar17->name)._M_dataplus._M_p;
      GetObjectFileDesc_abi_cxx11_(&objFile,this,pSVar17->objectFileIndex);
      _Var27 = objFile._M_dataplus;
      if (((__needle == (char *)0x0) ||
          (pcVar12 = strstr(pcVar13,__needle), _Var27 = objFile._M_dataplus, pcVar12 != (char *)0x0)
          ) || (pcVar12 = strstr(objFile._M_dataplus._M_p,__needle), pcVar12 != (char *)0x0)) {
        iVar28 = 0;
        bVar6 = true;
        sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %-80s %s\n",(ulong)(pSVar17->size >> 10),
                      (ulong)((pSVar17->size & 0x3ff) * 100 >> 10),pcVar13,_Var27._M_p);
      }
      else {
        bVar6 = false;
        iVar28 = 3;
      }
      std::__cxx11::string::~string((string *)&objFile);
      if (((!bVar6) && (iVar28 != 3)) && (iVar28 != 0)) break;
    }
  }
  sAppendPrintF(__return_storage_ptr__,
                "\nAggregated templates by size (kilobytes, min %.2f / %i):\n",
                SUB84((double)filters->minTemplate * 0.0009765625,0),
                (ulong)(uint)filters->minTemplateCount);
  pTVar16 = (this->m_Templates).super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->m_Templates).super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar16 != pTVar2) {
    uVar11 = ((long)pTVar2 - (long)pTVar16) / 0x28;
    lVar5 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<TemplateInfo*,std::vector<TemplateInfo,std::allocator<TemplateInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__1>>
              (pTVar16,pTVar2,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pTVar2 - (long)pTVar16 < 0x281) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<TemplateInfo*,std::vector<TemplateInfo,std::allocator<TemplateInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__1>>
                (pTVar16,pTVar2);
    }
    else {
      pTVar21 = pTVar16 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<TemplateInfo*,std::vector<TemplateInfo,std::allocator<TemplateInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__1>>
                (pTVar16,pTVar21);
      for (; pTVar21 != pTVar2; pTVar21 = pTVar21 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<TemplateInfo*,std::vector<TemplateInfo,std::allocator<TemplateInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__1>>
                  (pTVar21);
      }
    }
  }
  pTVar2 = (this->m_Templates).super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pTVar16 = (this->m_Templates).super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      (pTVar16 != pTVar2 && (uVar15 = pTVar16->size, (uint)filters->minTemplate <= uVar15));
      pTVar16 = pTVar16 + 1) {
    uVar29 = pTVar16->count;
    if (((uint)filters->minTemplateCount <= uVar29) &&
       ((pcVar13 = (pTVar16->name)._M_dataplus._M_p, __needle == (char *)0x0 ||
        (pcVar12 = strstr(pcVar13,__needle), pcVar12 != (char *)0x0)))) {
      sAppendPrintF(__return_storage_ptr__,"%5d.%02d #%5d: %s\n",(ulong)(uVar15 >> 10),
                    (ulong)((uVar15 & 0x3ff) * 100 >> 10),(ulong)uVar29,pcVar13);
    }
  }
  sAppendPrintF(__return_storage_ptr__,"\nData by size (kilobytes, min %.2f):\n",
                SUB84((double)filters->minData * 0.0009765625,0));
  pSVar17 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
LAB_00102faa:
  uVar15 = filters->minData;
  if ((pSVar17 == pSVar1) || (pSVar17->size < uVar15)) goto LAB_00103084;
  if (pSVar17->sectionType == Data) {
    pcVar13 = (pSVar17->name)._M_dataplus._M_p;
    GetObjectFileDesc_abi_cxx11_(&objFile,this,pSVar17->objectFileIndex);
    _Var27 = objFile._M_dataplus;
    if (((__needle == (char *)0x0) ||
        (pcVar12 = strstr(pcVar13,__needle), _Var27 = objFile._M_dataplus, pcVar12 != (char *)0x0))
       || (pcVar12 = strstr(objFile._M_dataplus._M_p,__needle), pcVar12 != (char *)0x0)) {
      iVar28 = 0;
      bVar6 = true;
      sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %-50s %s\n",(ulong)(pSVar17->size >> 10),
                    (ulong)((pSVar17->size & 0x3ff) * 100 >> 10),pcVar13,_Var27._M_p);
    }
    else {
      bVar6 = false;
      iVar28 = 7;
    }
    std::__cxx11::string::~string((string *)&objFile);
    if (((!bVar6) && (iVar28 != 0)) && (iVar28 != 7)) {
      uVar15 = filters->minData;
LAB_00103084:
      sAppendPrintF(__return_storage_ptr__,"\nBSS by size (kilobytes, min %.2f):\n",
                    SUB84((double)(int)uVar15 * 0.0009765625,0));
      pSVar1 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (pSVar17 = (this->m_Symbols).super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          (pSVar17 != pSVar1 && ((uint)filters->minData <= pSVar17->size)); pSVar17 = pSVar17 + 1) {
        if (pSVar17->sectionType == BSS) {
          pcVar13 = (pSVar17->name)._M_dataplus._M_p;
          GetObjectFileDesc_abi_cxx11_(&objFile,this,pSVar17->objectFileIndex);
          _Var27 = objFile._M_dataplus;
          if (((__needle == (char *)0x0) ||
              (pcVar12 = strstr(pcVar13,__needle), _Var27 = objFile._M_dataplus,
              pcVar12 != (char *)0x0)) ||
             (pcVar12 = strstr(objFile._M_dataplus._M_p,__needle), pcVar12 != (char *)0x0)) {
            iVar28 = 0;
            bVar6 = true;
            sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %-50s %s\n",(ulong)(pSVar17->size >> 10)
                          ,(ulong)((pSVar17->size & 0x3ff) * 100 >> 10),pcVar13,_Var27._M_p);
          }
          else {
            bVar6 = false;
            iVar28 = 9;
          }
          std::__cxx11::string::~string((string *)&objFile);
          if (((!bVar6) && (iVar28 != 9)) && (iVar28 != 0)) break;
        }
      }
      sAppendPrintF(__return_storage_ptr__,
                    "\nClasses/Namespaces by code size (kilobytes, min %.2f):\n",
                    SUB84((double)filters->minClass * 0.0009765625,0));
      nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pvVar3 = (this->m_Namespaces).
               super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (__x = (this->m_Namespaces).
                 super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
                 super__Vector_impl_data._M_start;
          pNVar9 = nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
          pNVar18 = nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start, __x != pvVar3; __x = __x + 1) {
        if ((uint)filters->minClass <= __x->codeSize) {
          std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::push_back(&nameSpaces,__x);
        }
      }
      pNVar7 = nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
          super__Vector_impl_data._M_start !=
          nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar22 = (long)nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar11 = lVar22 / 0x30;
        lVar5 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<NamespaceInfo*,std::vector<NamespaceInfo,std::allocator<NamespaceInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__2>>
                  (nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar22 < 0x301) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<NamespaceInfo*,std::vector<NamespaceInfo,std::allocator<NamespaceInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__2>>
                    (pNVar18,pNVar9);
          pNVar18 = nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pNVar7 = nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          pNVar23 = pNVar18 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<NamespaceInfo*,std::vector<NamespaceInfo,std::allocator<NamespaceInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__2>>
                    (pNVar18,pNVar23);
          for (; pNVar18 = nameSpaces.
                           super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>._M_impl
                           .super__Vector_impl_data._M_start,
              pNVar7 = nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                       _M_impl.super__Vector_impl_data._M_finish, pNVar23 != pNVar9;
              pNVar23 = pNVar23 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<NamespaceInfo*,std::vector<NamespaceInfo,std::allocator<NamespaceInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__2>>
                      (pNVar23);
          }
        }
      }
      for (; pNVar18 != pNVar7; pNVar18 = pNVar18 + 1) {
        pcVar13 = (pNVar18->name)._M_dataplus._M_p;
        if ((__needle == (char *)0x0) ||
           (pcVar12 = strstr(pcVar13,__needle), pcVar12 != (char *)0x0)) {
          sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %s\n",(ulong)(pNVar18->codeSize >> 10),
                        (ulong)((pNVar18->codeSize & 0x3ff) * 100 >> 10),pcVar13);
        }
      }
      sAppendPrintF(__return_storage_ptr__,"\nObject files by code size (kilobytes, min %.2f):\n",
                    SUB84((double)filters->minFile * 0.0009765625,0));
      objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pvVar4 = (this->m_ObjectFiles).
               super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pvVar24 = (this->m_ObjectFiles).
                     super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pOVar19 = objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
          pOVar8 = objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start, pvVar24 != pvVar4;
          pvVar24 = pvVar24 + 1) {
        if (((uint)filters->minFile <= pvVar24->codeSize) ||
           ((uint)filters->minFile <= pvVar24->contribCodeSize)) {
          std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::push_back
                    (&objectFiles,pvVar24);
        }
      }
      if (objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
          super__Vector_impl_data._M_start !=
          objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar22 = (long)objectFiles.
                       super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)objectFiles.
                       super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar11 = lVar22 / 0x58;
        lVar5 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__3>>
                  (objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar22 < 0x581) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__3>>
                    (pOVar8,pOVar19);
        }
        else {
          pOVar25 = pOVar8 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__3>>
                    (pOVar8,pOVar25);
          for (; pOVar25 != pOVar19; pOVar25 = pOVar25 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__3>>
                      (pOVar25);
          }
        }
      }
      pOVar8 = objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pOVar19 = objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start; pOVar19 != pOVar8;
          pOVar19 = pOVar19 + 1) {
        GetObjectFileDesc_abi_cxx11_(&objFile,this,pOVar19->index);
        if ((__needle == (char *)0x0) ||
           (pcVar13 = strstr(objFile._M_dataplus._M_p,__needle), pcVar13 != (char *)0x0)) {
          uVar15 = pOVar19->codeSize;
          uVar29 = pOVar19->contribCodeSize;
          uVar11 = (ulong)((uVar29 & 0x3ff) * 100 >> 10);
          if ((float)uVar29 <= (float)uVar15 * 1.2) {
            sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %s\n",(ulong)(uVar29 >> 10),uVar11,
                          objFile._M_dataplus._M_p);
          }
          else {
            sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %s [%d.%02d with symbols]\n",
                          (ulong)(uVar29 >> 10),uVar11,objFile._M_dataplus._M_p,
                          (ulong)(uVar15 >> 10),(uVar15 & 0x3ff) * 100 >> 10);
          }
        }
        std::__cxx11::string::~string((string *)&objFile);
      }
      sAppendPrintF(__return_storage_ptr__,"\nObject files by data size (kilobytes, min %.2f):\n",
                    SUB84((double)filters->minFile * 0.0009765625,0));
      std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::clear(&objectFiles);
      pvVar4 = (this->m_ObjectFiles).
               super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pvVar24 = (this->m_ObjectFiles).
                     super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pOVar19 = objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
          pOVar8 = objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start, pvVar24 != pvVar4;
          pvVar24 = pvVar24 + 1) {
        if (((uint)filters->minFile <= pvVar24->dataSize) ||
           ((uint)filters->minFile <= pvVar24->contribDataSize)) {
          std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::push_back
                    (&objectFiles,pvVar24);
        }
      }
      if (objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
          super__Vector_impl_data._M_start !=
          objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar22 = (long)objectFiles.
                       super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)objectFiles.
                       super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar11 = lVar22 / 0x58;
        lVar5 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__4>>
                  (objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar22 < 0x581) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__4>>
                    (pOVar8,pOVar19);
        }
        else {
          pOVar25 = pOVar8 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__4>>
                    (pOVar8,pOVar25);
          for (; pOVar25 != pOVar19; pOVar25 = pOVar25 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__4>>
                      (pOVar25);
          }
        }
      }
      pOVar8 = objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pOVar19 = objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start; pOVar19 != pOVar8;
          pOVar19 = pOVar19 + 1) {
        GetObjectFileDesc_abi_cxx11_(&objFile,this,pOVar19->index);
        if ((__needle == (char *)0x0) ||
           (pcVar13 = strstr(objFile._M_dataplus._M_p,__needle), pcVar13 != (char *)0x0)) {
          uVar15 = pOVar19->dataSize;
          uVar29 = pOVar19->contribDataSize;
          uVar11 = (ulong)((uVar29 & 0x3ff) * 100 >> 10);
          if ((float)uVar29 <= (float)uVar15 * 1.2) {
            sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %s\n",(ulong)(uVar29 >> 10),uVar11,
                          objFile._M_dataplus._M_p);
          }
          else {
            sAppendPrintF(__return_storage_ptr__,"%5d.%02d: %s [%d.%02d with symbols]\n",
                          (ulong)(uVar29 >> 10),uVar11,objFile._M_dataplus._M_p,
                          (ulong)(uVar15 >> 10),(uVar15 & 0x3ff) * 100 >> 10);
          }
        }
        std::__cxx11::string::~string((string *)&objFile);
      }
      uVar29 = 0;
      uVar15 = 0;
      for (pCVar14 = (this->m_Contribs).
                     super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pCVar14 !=
          (this->m_Contribs).super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
          super__Vector_impl_data._M_finish; pCVar14 = pCVar14 + 1) {
        uVar10 = pCVar14->size;
        uVar26 = 0;
        if (pCVar14->sectionType == Code) {
          uVar26 = uVar10;
        }
        uVar29 = uVar29 + uVar26;
        if (pCVar14->sectionType != Data) {
          uVar10 = 0;
        }
        uVar15 = uVar15 + uVar10;
      }
      uVar10 = CountSizeInSection(this,Code);
      sAppendPrintF(__return_storage_ptr__,"\nOverall code:  %5d.%02d kb (%d.%02d with symbols)\n",
                    (ulong)(uVar29 >> 10),(ulong)((uVar29 & 0x3ff) * 100 >> 10),
                    (ulong)(uVar10 >> 10),(ulong)((uVar10 & 0x3ff) * 100 >> 10));
      uVar10 = CountSizeInSection(this,Data);
      sAppendPrintF(__return_storage_ptr__,"Overall data:  %5d.%02d kb (%d.%02d with symbols)\n",
                    (ulong)(uVar15 >> 10),(ulong)((uVar15 & 0x3ff) * 100 >> 10),
                    (ulong)(uVar10 >> 10),(ulong)((uVar10 & 0x3ff) * 100 >> 10));
      uVar10 = CountSizeInSection(this,BSS);
      sAppendPrintF(__return_storage_ptr__,"Overall BSS:   %5d.%02d kb\n",(ulong)(uVar10 >> 10),
                    (ulong)((uVar10 & 0x3ff) * 100 >> 10));
      uVar10 = CountSizeInSection(this,Unknown);
      if (uVar10 != 0) {
        sAppendPrintF(__return_storage_ptr__,"Overall other: %5d.%02d kb\n",(ulong)(uVar10 >> 10),
                      (ulong)((uVar10 & 0x3ff) * 100 >> 10));
      }
      std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::~vector(&objectFiles);
      std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::~vector(&nameSpaces);
      return __return_storage_ptr__;
    }
  }
  pSVar17 = pSVar17 + 1;
  goto LAB_00102faa;
}

Assistant:

std::string DebugInfo::WriteReport(const DebugFilters& filters)
{
    std::string Report;
    const char* filterName = filters.name.empty() ? NULL : filters.name.c_str();

    Report.reserve(64 * 1024);
    if (filterName)
    {
        sAppendPrintF(Report, "Only including things with '%s' in their name/file\n\n", filterName);
    }

    // symbols
    sAppendPrintF(Report, "Functions by size (kilobytes, min %.2f):\n", filters.minFunction/1024.0);
    std::sort(m_Symbols.begin(), m_Symbols.end(), [](const auto& a, const auto& b) {
        if (a.size != b.size)
            return a.size > b.size;
        if (a.objectFileIndex != b.objectFileIndex)
            return a.objectFileIndex < b.objectFileIndex;
        return a.name < b.name;
    });

    for (const auto& sym : m_Symbols)
    {
        if (sym.size < filters.minFunction)
            break;
        if (sym.sectionType == SectionType::Code)
        {
            const char* name1 = sym.name.c_str();
            std::string objFile = GetObjectFileDesc(sym.objectFileIndex);
            if (filterName && !strstr(name1, filterName) && !strstr(objFile.c_str(), filterName))
                continue;
            sAppendPrintF(Report, "%5d.%02d: %-80s %s\n",
                sym.size / 1024, (sym.size % 1024) * 100 / 1024,
                name1, objFile.c_str());
        }
    }

    // templates
    sAppendPrintF(Report, "\nAggregated templates by size (kilobytes, min %.2f / %i):\n", filters.minTemplate/1024.0, filters.minTemplateCount);

    std::sort(m_Templates.begin(), m_Templates.end(), [](const auto& a, const auto& b) {
        if (a.size != b.size)
            return a.size > b.size;
        if (a.count != b.count)
            return a.count > b.count;
        return a.name < b.name;
    });

    for (const auto& tpl : m_Templates)
    {
        if (tpl.size < filters.minTemplate)
            break;
        if (tpl.count < filters.minTemplateCount)
            continue;
        const char* name1 = tpl.name.c_str();
        if (filterName && !strstr(name1, filterName))
            continue;
        sAppendPrintF(Report, "%5d.%02d #%5d: %s\n",
            tpl.size / 1024, (tpl.size % 1024) * 100 / 1024,
            tpl.count,
            name1);
    }

    sAppendPrintF(Report, "\nData by size (kilobytes, min %.2f):\n", filters.minData/1024.0);
    for (const auto& sym : m_Symbols)
    {
        if (sym.size < filters.minData)
            break;
        if (sym.sectionType == SectionType::Data)
        {
            const char* name1 = sym.name.c_str();
            std::string objFile = GetObjectFileDesc(sym.objectFileIndex);
            if (filterName && !strstr(name1, filterName) && !strstr(objFile.c_str(), filterName))
                continue;
            sAppendPrintF(Report, "%5d.%02d: %-50s %s\n",
                sym.size / 1024, (sym.size % 1024) * 100 / 1024,
                name1, objFile.c_str());
        }
    }

    sAppendPrintF(Report, "\nBSS by size (kilobytes, min %.2f):\n", filters.minData/1024.0);
    for (const auto& sym : m_Symbols)
    {
        if (sym.size < filters.minData)
            break;
        if (sym.sectionType == SectionType::BSS)
        {
            const char* name1 = sym.name.c_str();
            std::string objFile = GetObjectFileDesc(sym.objectFileIndex);
            if (filterName && !strstr(name1, filterName) && !strstr(objFile.c_str(), filterName))
                continue;
            sAppendPrintF(Report, "%5d.%02d: %-50s %s\n",
                sym.size / 1024, (sym.size % 1024) * 100 / 1024,
                name1, objFile.c_str());
        }
    }

    sAppendPrintF(Report, "\nClasses/Namespaces by code size (kilobytes, min %.2f):\n", filters.minClass/1024.0);
    std::vector<NamespaceInfo> nameSpaces;
    for (const auto& n : m_Namespaces)
    {
        if (n.codeSize >= filters.minClass)
            nameSpaces.push_back(n);
    }
    std::sort(nameSpaces.begin(), nameSpaces.end(), [](const auto& a, const auto& b)
    {
        if (a.codeSize != b.codeSize)
            return a.codeSize > b.codeSize;
        if (a.dataSize != b.dataSize)
            return a.dataSize > b.dataSize;
        return a.name < b.name;
    });
    for (const auto& n : nameSpaces)
    {
        const std::string& name = n.name;
        if (filterName && !strstr(name.c_str(), filterName))
            continue;
        sAppendPrintF(Report, "%5d.%02d: %s\n",
            n.codeSize / 1024, (n.codeSize % 1024) * 100 / 1024, name.c_str());
    }

    sAppendPrintF(Report, "\nObject files by code size (kilobytes, min %.2f):\n", filters.minFile/1024.0);
    std::vector<ObjectFileInfo> objectFiles;
    for (const auto& f : m_ObjectFiles)
    {
        if (f.codeSize >= filters.minFile || f.contribCodeSize >= filters.minFile)
            objectFiles.push_back(f);
    }
    std::sort(objectFiles.begin(), objectFiles.end(), [](const ObjectFileInfo& a, const ObjectFileInfo& b) {
        if (a.contribCodeSize != b.contribCodeSize)
            return a.contribCodeSize > b.contribCodeSize;
        if (a.codeSize != b.codeSize)
            return a.codeSize > b.codeSize;
        return a.index < b.index;
    });
    for (const auto& f : objectFiles)
    {
        std::string objFile = GetObjectFileDesc(f.index);
        if (filterName && !strstr(objFile.c_str(), filterName))
            continue;

        if (f.codeSize * 1.2f >= f.contribCodeSize)
        {
            sAppendPrintF(Report, "%5d.%02d: %s\n",
                f.contribCodeSize / 1024, (f.contribCodeSize % 1024) * 100 / 1024,
                objFile.c_str());
        }
        else
        {
            sAppendPrintF(Report, "%5d.%02d: %s [%d.%02d with symbols]\n",
                f.contribCodeSize / 1024, (f.contribCodeSize % 1024) * 100 / 1024,
                objFile.c_str(),
                f.codeSize / 1024, (f.codeSize % 1024) * 100 / 1024);
        }
    }

    sAppendPrintF(Report, "\nObject files by data size (kilobytes, min %.2f):\n", filters.minFile / 1024.0);
    objectFiles.clear();
    for (const auto& f : m_ObjectFiles)
    {
        if (f.dataSize >= filters.minFile || f.contribDataSize >= filters.minFile)
            objectFiles.push_back(f);
    }
    std::sort(objectFiles.begin(), objectFiles.end(), [](const ObjectFileInfo& a, const ObjectFileInfo& b) {
        if (a.contribDataSize != b.contribDataSize)
            return a.contribDataSize > b.contribDataSize;
        if (a.dataSize != b.dataSize)
            return a.dataSize > b.dataSize;
        return a.index < b.index;
        });
    for (const auto& f : objectFiles)
    {
        std::string objFile = GetObjectFileDesc(f.index);
        if (filterName && !strstr(objFile.c_str(), filterName))
            continue;

        if (f.dataSize * 1.2f >= f.contribDataSize)
        {
            sAppendPrintF(Report, "%5d.%02d: %s\n",
                f.contribDataSize / 1024, (f.contribDataSize % 1024) * 100 / 1024,
                objFile.c_str());
        }
        else
        {
            sAppendPrintF(Report, "%5d.%02d: %s [%d.%02d with symbols]\n",
                f.contribDataSize / 1024, (f.contribDataSize % 1024) * 100 / 1024,
                objFile.c_str(),
                f.dataSize / 1024, (f.dataSize % 1024) * 100 / 1024);
        }
    }


    uint32_t contribCodeSize = 0, contribDataSize = 0;
    for (const auto& cnt : m_Contribs)
    {
        if (cnt.sectionType == SectionType::Code)
            contribCodeSize += cnt.size;
        if (cnt.sectionType == SectionType::Data)
            contribDataSize += cnt.size;
    }

    uint32_t size;
    size = CountSizeInSection(SectionType::Code);
    sAppendPrintF(Report, "\nOverall code:  %5d.%02d kb (%d.%02d with symbols)\n", contribCodeSize / 1024, (contribCodeSize % 1024) * 100 / 1024, size / 1024, (size % 1024) * 100 / 1024);

    size = CountSizeInSection(SectionType::Data);
    sAppendPrintF(Report, "Overall data:  %5d.%02d kb (%d.%02d with symbols)\n", contribDataSize / 1024, (contribDataSize % 1024) * 100 / 1024, size / 1024, (size % 1024) * 100 / 1024);

    size = CountSizeInSection(SectionType::BSS);
    sAppendPrintF(Report, "Overall BSS:   %5d.%02d kb\n", size / 1024,
        (size % 1024) * 100 / 1024);

    size = CountSizeInSection(SectionType::Unknown);
    if (size > 0)
    {
        sAppendPrintF(Report, "Overall other: %5d.%02d kb\n", size / 1024,
            (size % 1024) * 100 / 1024);
    }

    return Report;
}